

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
* __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator::operator()
          (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *__return_storage_ptr__,DepsGenerator *this,Descriptor *desc)

{
  Descriptor *in_RAX;
  long lVar1;
  int index;
  Descriptor *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < *(int *)(desc + 4)) {
    index = 0;
    local_28 = in_RAX;
    do {
      Descriptor::field(desc,index);
      lVar1 = google::protobuf::FieldDescriptor::message_type();
      if (lVar1 != 0) {
        Descriptor::field(desc,index);
        local_28 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::emplace_back<google::protobuf::Descriptor_const*>
                  ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                    *)__return_storage_ptr__,&local_28);
      }
      index = index + 1;
    } while (index < *(int *)(desc + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Descriptor*> operator()(const Descriptor* desc) const {
      std::vector<const Descriptor*> deps;
      for (int i = 0; i < desc->field_count(); i++) {
        if (desc->field(i)->message_type()) {
          deps.push_back(desc->field(i)->message_type());
        }
      }
      return deps;
    }